

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixVector.h
# Opt level: O2

void Eigen::internal::general_matrix_vector_product<long,_double,_1,_false,_double,_false,_0>::run
               (long rows,long cols,double *lhs,long lhsStride,double *rhs,long rhsIncr,
               ResScalar *res,long resIncr,ResScalar alpha)

{
  double dVar1;
  long lVar2;
  long j;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long j_1;
  ulong uVar8;
  long lVar9;
  long lVar10;
  double *pdVar11;
  double *pdVar12;
  double *pdVar13;
  double *pdVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  ulong local_b0;
  
  uVar6 = (ulong)((uint)((ulong)rhs >> 3) & 1);
  if (cols <= (long)uVar6) {
    uVar6 = cols;
  }
  if (((ulong)rhs & 7) != 0) {
    uVar6 = cols;
  }
  uVar5 = (ulong)((uint)lhsStride & 1);
  uVar8 = (ulong)((uint)((ulong)lhs >> 3) & 1);
  if (cols <= (long)uVar8) {
    uVar8 = cols;
  }
  if (((ulong)lhs & 7) != 0) {
    uVar8 = cols;
  }
  if ((((uint)rhs | (uint)lhs) & 7) == 0) {
    lVar10 = (cols - uVar6 & 0xfffffffffffffffe) + uVar6;
    local_b0 = 3;
    for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
      if (uVar6 == (long)uVar8 % 2) {
        local_b0 = uVar5;
        if (rows <= lVar7) {
          lVar7 = rows;
        }
        goto LAB_0011046b;
      }
      uVar8 = uVar8 + uVar5;
    }
    lVar7 = 0;
  }
  else {
    lVar10 = 0;
    uVar6 = 0;
    lVar7 = 0;
    local_b0 = uVar5;
  }
LAB_0011046b:
  uVar8 = 0;
  if (0 < (long)uVar6) {
    uVar8 = uVar6;
  }
  lVar2 = lVar7 + ((rows - lVar7) / 4) * 4;
  pdVar11 = lhs + lVar7 * lhsStride;
  pdVar14 = lhs + (lVar7 + uVar5 * 2 + 1) * lhsStride;
  pdVar12 = lhs + (lVar7 + 2) * lhsStride;
  pdVar13 = lhs + (lVar7 + (ulong)(uVar5 == 0) * 2 + 1) * lhsStride;
  lVar4 = lVar7;
  while( true ) {
    if (lVar2 <= lVar4) {
      do {
        lVar4 = lVar7;
        pdVar13 = (double *)(lhsStride * 8 * lVar2 + (long)lhs);
        for (; lVar2 < rows; lVar2 = lVar2 + 1) {
          dVar15 = 0.0;
          for (uVar5 = 0; uVar8 != uVar5; uVar5 = uVar5 + 1) {
            dVar15 = dVar15 + pdVar13[uVar5] * rhs[uVar5];
          }
          lVar7 = lVar10;
          if ((long)uVar6 < lVar10) {
            dVar16 = 0.0;
            dVar17 = 0.0;
            uVar5 = uVar6;
            if (((int)lVar2 * (uint)lhsStride * 8 + (uint)lhs + (int)uVar6 * 8 & 0xf) == 0) {
              for (; (long)uVar5 < lVar10; uVar5 = uVar5 + 2) {
                dVar16 = dVar16 + pdVar13[uVar5] * rhs[uVar5];
                dVar17 = dVar17 + (pdVar13 + uVar5)[1] * (rhs + uVar5)[1];
              }
            }
            else {
              for (; (long)uVar5 < lVar10; uVar5 = uVar5 + 2) {
                dVar16 = dVar16 + pdVar13[uVar5] * rhs[uVar5];
                dVar17 = dVar17 + (pdVar13 + uVar5)[1] * (rhs + uVar5)[1];
              }
            }
            dVar15 = dVar15 + dVar17 + dVar16;
          }
          for (; lVar7 < cols; lVar7 = lVar7 + 1) {
            dVar15 = dVar15 + pdVar13[lVar7] * rhs[lVar7];
          }
          res[lVar2 * resIncr] = dVar15 * alpha + res[lVar2 * resIncr];
          pdVar13 = pdVar13 + lhsStride;
        }
        lVar2 = 0;
        lVar7 = 0;
        rows = lVar4;
      } while (lVar4 != 0);
      return;
    }
    dVar17 = 0.0;
    dVar18 = 0.0;
    dVar15 = 0.0;
    dVar16 = 0.0;
    for (uVar3 = 0; uVar8 != uVar3; uVar3 = uVar3 + 1) {
      dVar1 = rhs[uVar3];
      dVar15 = dVar15 + pdVar12[uVar3] * dVar1;
      dVar16 = dVar16 + pdVar13[uVar3] * dVar1;
      dVar17 = dVar17 + pdVar11[uVar3] * dVar1;
      dVar18 = dVar18 + pdVar14[uVar3] * dVar1;
    }
    lVar9 = lVar10;
    if ((long)uVar6 < lVar10) break;
    for (; lVar9 < cols; lVar9 = lVar9 + 1) {
      dVar1 = rhs[lVar9];
      dVar15 = dVar15 + pdVar12[lVar9] * dVar1;
      dVar16 = dVar16 + pdVar13[lVar9] * dVar1;
      dVar17 = dVar17 + pdVar11[lVar9] * dVar1;
      dVar18 = dVar18 + pdVar14[lVar9] * dVar1;
    }
    res[lVar4 * resIncr] = alpha * dVar17 + res[lVar4 * resIncr];
    lVar9 = (lVar4 + uVar5 * 2 + 1) * resIncr;
    res[lVar9] = dVar18 * alpha + res[lVar9];
    lVar9 = (lVar4 + 2) * resIncr;
    res[lVar9] = alpha * dVar15 + res[lVar9];
    lVar9 = ((ulong)(uVar5 == 0) * 2 + 1 + lVar4) * resIncr;
    res[lVar9] = dVar16 * alpha + res[lVar9];
    lVar4 = lVar4 + 4;
    pdVar11 = pdVar11 + lhsStride * 4;
    pdVar14 = pdVar14 + lhsStride * 4;
    pdVar12 = pdVar12 + lhsStride * 4;
    pdVar13 = pdVar13 + lhsStride * 4;
  }
  (*(code *)(&DAT_00113308 + *(int *)(&DAT_00113308 + local_b0 * 4)))();
  return;
}

Assistant:

EIGEN_DONT_INLINE void general_matrix_vector_product<Index,LhsScalar,RowMajor,ConjugateLhs,RhsScalar,ConjugateRhs,Version>::run(
  Index rows, Index cols,
  const LhsScalar* lhs, Index lhsStride,
  const RhsScalar* rhs, Index rhsIncr,
  ResScalar* res, Index resIncr,
  ResScalar alpha)
{
  EIGEN_UNUSED_VARIABLE(rhsIncr);
  eigen_internal_assert(rhsIncr==1);
  #ifdef _EIGEN_ACCUMULATE_PACKETS
  #error _EIGEN_ACCUMULATE_PACKETS has already been defined
  #endif

  #define _EIGEN_ACCUMULATE_PACKETS(A0,A13,A2) {\
    RhsPacket b = pload<RhsPacket>(&rhs[j]); \
    ptmp0 = pcj.pmadd(EIGEN_CAT(ploa,A0) <LhsPacket>(&lhs0[j]), b, ptmp0); \
    ptmp1 = pcj.pmadd(EIGEN_CAT(ploa,A13)<LhsPacket>(&lhs1[j]), b, ptmp1); \
    ptmp2 = pcj.pmadd(EIGEN_CAT(ploa,A2) <LhsPacket>(&lhs2[j]), b, ptmp2); \
    ptmp3 = pcj.pmadd(EIGEN_CAT(ploa,A13)<LhsPacket>(&lhs3[j]), b, ptmp3); }

  conj_helper<LhsScalar,RhsScalar,ConjugateLhs,ConjugateRhs> cj;
  conj_helper<LhsPacket,RhsPacket,ConjugateLhs,ConjugateRhs> pcj;

  enum { AllAligned=0, EvenAligned=1, FirstAligned=2, NoneAligned=3 };
  const Index rowsAtOnce = 4;
  const Index peels = 2;
  const Index RhsPacketAlignedMask = RhsPacketSize-1;
  const Index LhsPacketAlignedMask = LhsPacketSize-1;
//   const Index PeelAlignedMask = RhsPacketSize*peels-1;
  const Index depth = cols;

  // How many coeffs of the result do we have to skip to be aligned.
  // Here we assume data are at least aligned on the base scalar type
  // if that's not the case then vectorization is discarded, see below.
  Index alignedStart = internal::first_aligned(rhs, depth);
  Index alignedSize = RhsPacketSize>1 ? alignedStart + ((depth-alignedStart) & ~RhsPacketAlignedMask) : 0;
  const Index peeledSize = alignedSize - RhsPacketSize*peels - RhsPacketSize + 1;

  const Index alignmentStep = LhsPacketSize>1 ? (LhsPacketSize - lhsStride % LhsPacketSize) & LhsPacketAlignedMask : 0;
  Index alignmentPattern = alignmentStep==0 ? AllAligned
                         : alignmentStep==(LhsPacketSize/2) ? EvenAligned
                         : FirstAligned;

  // we cannot assume the first element is aligned because of sub-matrices
  const Index lhsAlignmentOffset = internal::first_aligned(lhs,depth);

  // find how many rows do we have to skip to be aligned with rhs (if possible)
  Index skipRows = 0;
  // if the data cannot be aligned (TODO add some compile time tests when possible, e.g. for floats)
  if( (sizeof(LhsScalar)!=sizeof(RhsScalar)) || (size_t(lhs)%sizeof(LhsScalar)) || (size_t(rhs)%sizeof(RhsScalar)) )
  {
    alignedSize = 0;
    alignedStart = 0;
  }
  else if (LhsPacketSize>1)
  {
    eigen_internal_assert(size_t(lhs+lhsAlignmentOffset)%sizeof(LhsPacket)==0  || depth<LhsPacketSize);

    while (skipRows<LhsPacketSize &&
           alignedStart != ((lhsAlignmentOffset + alignmentStep*skipRows)%LhsPacketSize))
      ++skipRows;
    if (skipRows==LhsPacketSize)
    {
      // nothing can be aligned, no need to skip any column
      alignmentPattern = NoneAligned;
      skipRows = 0;
    }
    else
    {
      skipRows = (std::min)(skipRows,Index(rows));
      // note that the skiped columns are processed later.
    }
    eigen_internal_assert(  alignmentPattern==NoneAligned
                      || LhsPacketSize==1
                      || (skipRows + rowsAtOnce >= rows)
                      || LhsPacketSize > depth
                      || (size_t(lhs+alignedStart+lhsStride*skipRows)%sizeof(LhsPacket))==0);
  }
  else if(Vectorizable)
  {
    alignedStart = 0;
    alignedSize = depth;
    alignmentPattern = AllAligned;
  }

  Index offset1 = (FirstAligned && alignmentStep==1?3:1);
  Index offset3 = (FirstAligned && alignmentStep==1?1:3);

  Index rowBound = ((rows-skipRows)/rowsAtOnce)*rowsAtOnce + skipRows;
  for (Index i=skipRows; i<rowBound; i+=rowsAtOnce)
  {
    EIGEN_ALIGN16 ResScalar tmp0 = ResScalar(0);
    ResScalar tmp1 = ResScalar(0), tmp2 = ResScalar(0), tmp3 = ResScalar(0);

    // this helps the compiler generating good binary code
    const LhsScalar *lhs0 = lhs + i*lhsStride,     *lhs1 = lhs + (i+offset1)*lhsStride,
                    *lhs2 = lhs + (i+2)*lhsStride, *lhs3 = lhs + (i+offset3)*lhsStride;

    if (Vectorizable)
    {
      /* explicit vectorization */
      ResPacket ptmp0 = pset1<ResPacket>(ResScalar(0)), ptmp1 = pset1<ResPacket>(ResScalar(0)),
                ptmp2 = pset1<ResPacket>(ResScalar(0)), ptmp3 = pset1<ResPacket>(ResScalar(0));

      // process initial unaligned coeffs
      // FIXME this loop get vectorized by the compiler !
      for (Index j=0; j<alignedStart; ++j)
      {
        RhsScalar b = rhs[j];
        tmp0 += cj.pmul(lhs0[j],b); tmp1 += cj.pmul(lhs1[j],b);
        tmp2 += cj.pmul(lhs2[j],b); tmp3 += cj.pmul(lhs3[j],b);
      }

      if (alignedSize>alignedStart)
      {
        switch(alignmentPattern)
        {
          case AllAligned:
            for (Index j = alignedStart; j<alignedSize; j+=RhsPacketSize)
              _EIGEN_ACCUMULATE_PACKETS(d,d,d);
            break;
          case EvenAligned:
            for (Index j = alignedStart; j<alignedSize; j+=RhsPacketSize)
              _EIGEN_ACCUMULATE_PACKETS(d,du,d);
            break;
          case FirstAligned:
          {
            Index j = alignedStart;
            if (peels>1)
            {
              /* Here we proccess 4 rows with with two peeled iterations to hide
               * the overhead of unaligned loads. Moreover unaligned loads are handled
               * using special shift/move operations between the two aligned packets
               * overlaping the desired unaligned packet. This is *much* more efficient
               * than basic unaligned loads.
               */
              LhsPacket A01, A02, A03, A11, A12, A13;
              A01 = pload<LhsPacket>(&lhs1[alignedStart-1]);
              A02 = pload<LhsPacket>(&lhs2[alignedStart-2]);
              A03 = pload<LhsPacket>(&lhs3[alignedStart-3]);

              for (; j<peeledSize; j+=peels*RhsPacketSize)
              {
                RhsPacket b = pload<RhsPacket>(&rhs[j]);
                A11 = pload<LhsPacket>(&lhs1[j-1+LhsPacketSize]);  palign<1>(A01,A11);
                A12 = pload<LhsPacket>(&lhs2[j-2+LhsPacketSize]);  palign<2>(A02,A12);
                A13 = pload<LhsPacket>(&lhs3[j-3+LhsPacketSize]);  palign<3>(A03,A13);

                ptmp0 = pcj.pmadd(pload<LhsPacket>(&lhs0[j]), b, ptmp0);
                ptmp1 = pcj.pmadd(A01, b, ptmp1);
                A01 = pload<LhsPacket>(&lhs1[j-1+2*LhsPacketSize]);  palign<1>(A11,A01);
                ptmp2 = pcj.pmadd(A02, b, ptmp2);
                A02 = pload<LhsPacket>(&lhs2[j-2+2*LhsPacketSize]);  palign<2>(A12,A02);
                ptmp3 = pcj.pmadd(A03, b, ptmp3);
                A03 = pload<LhsPacket>(&lhs3[j-3+2*LhsPacketSize]);  palign<3>(A13,A03);

                b = pload<RhsPacket>(&rhs[j+RhsPacketSize]);
                ptmp0 = pcj.pmadd(pload<LhsPacket>(&lhs0[j+LhsPacketSize]), b, ptmp0);
                ptmp1 = pcj.pmadd(A11, b, ptmp1);
                ptmp2 = pcj.pmadd(A12, b, ptmp2);
                ptmp3 = pcj.pmadd(A13, b, ptmp3);
              }
            }
            for (; j<alignedSize; j+=RhsPacketSize)
              _EIGEN_ACCUMULATE_PACKETS(d,du,du);
            break;
          }
          default:
            for (Index j = alignedStart; j<alignedSize; j+=RhsPacketSize)
              _EIGEN_ACCUMULATE_PACKETS(du,du,du);
            break;
        }
        tmp0 += predux(ptmp0);
        tmp1 += predux(ptmp1);
        tmp2 += predux(ptmp2);
        tmp3 += predux(ptmp3);
      }
    } // end explicit vectorization

    // process remaining coeffs (or all if no explicit vectorization)
    // FIXME this loop get vectorized by the compiler !
    for (Index j=alignedSize; j<depth; ++j)
    {
      RhsScalar b = rhs[j];
      tmp0 += cj.pmul(lhs0[j],b); tmp1 += cj.pmul(lhs1[j],b);
      tmp2 += cj.pmul(lhs2[j],b); tmp3 += cj.pmul(lhs3[j],b);
    }
    res[i*resIncr]            += alpha*tmp0;
    res[(i+offset1)*resIncr]  += alpha*tmp1;
    res[(i+2)*resIncr]        += alpha*tmp2;
    res[(i+offset3)*resIncr]  += alpha*tmp3;
  }

  // process remaining first and last rows (at most columnsAtOnce-1)
  Index end = rows;
  Index start = rowBound;
  do
  {
    for (Index i=start; i<end; ++i)
    {
      EIGEN_ALIGN16 ResScalar tmp0 = ResScalar(0);
      ResPacket ptmp0 = pset1<ResPacket>(tmp0);
      const LhsScalar* lhs0 = lhs + i*lhsStride;
      // process first unaligned result's coeffs
      // FIXME this loop get vectorized by the compiler !
      for (Index j=0; j<alignedStart; ++j)
        tmp0 += cj.pmul(lhs0[j], rhs[j]);

      if (alignedSize>alignedStart)
      {
        // process aligned rhs coeffs
        if ((size_t(lhs0+alignedStart)%sizeof(LhsPacket))==0)
          for (Index j = alignedStart;j<alignedSize;j+=RhsPacketSize)
            ptmp0 = pcj.pmadd(pload<LhsPacket>(&lhs0[j]), pload<RhsPacket>(&rhs[j]), ptmp0);
        else
          for (Index j = alignedStart;j<alignedSize;j+=RhsPacketSize)
            ptmp0 = pcj.pmadd(ploadu<LhsPacket>(&lhs0[j]), pload<RhsPacket>(&rhs[j]), ptmp0);
        tmp0 += predux(ptmp0);
      }

      // process remaining scalars
      // FIXME this loop get vectorized by the compiler !
      for (Index j=alignedSize; j<depth; ++j)
        tmp0 += cj.pmul(lhs0[j], rhs[j]);
      res[i*resIncr] += alpha*tmp0;
    }
    if (skipRows)
    {
      start = 0;
      end = skipRows;
      skipRows = 0;
    }
    else
      break;
  } while(Vectorizable);

  #undef _EIGEN_ACCUMULATE_PACKETS
}